

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

void * matras_alloc_internal(matras *m)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  void *local_50;
  char *extent3;
  void **extent2;
  void **extent1;
  matras_id_t n3;
  matras_id_t extent3_available;
  matras_id_t n2;
  matras_id_t extent2_available;
  matras_id_t n1;
  matras_id_t extent1_available;
  matras_id_t id;
  matras *m_local;
  
  uVar1 = (uint)(m->head).block_count;
  uVar2 = uVar1 >> ((byte)m->shift1 & 0x1f);
  uVar3 = m->mask1 & uVar1;
  uVar4 = uVar3 >> ((byte)m->shift2 & 0x1f);
  uVar5 = m->mask2 & uVar3;
  if (uVar1 == 0) {
    extent2 = (void **)matras_alloc_extent(m);
    if (extent2 == (void **)0x0) {
      return (void *)0x0;
    }
    (m->head).root = extent2;
  }
  else {
    extent2 = (void **)(m->head).root;
  }
  if (uVar3 == 0) {
    extent3 = (char *)matras_alloc_extent(m);
    if (extent3 == (char *)0x0) {
      if (uVar1 == 0) {
        matras_free_extent(m,extent2);
      }
      return (void *)0x0;
    }
    extent2[uVar2] = extent3;
  }
  else {
    extent3 = (char *)extent2[uVar2];
  }
  if (uVar5 == 0) {
    local_50 = matras_alloc_extent(m);
    if (local_50 == (void *)0x0) {
      if (uVar1 == 0) {
        matras_free_extent(m,extent2);
      }
      if (uVar3 == 0) {
        matras_free_extent(m,extent3);
      }
      return (void *)0x0;
    }
    *(void **)(extent3 + (ulong)uVar4 * 8) = local_50;
  }
  else {
    local_50 = *(void **)(extent3 + (ulong)uVar4 * 8);
  }
  return (void *)((long)local_50 + (ulong)(uVar5 * m->block_size));
}

Assistant:

static void *
matras_alloc_internal(struct matras *m)
{
	/* Current block_count is the ID of new block */
	matras_id_t id = m->head.block_count;

	/* See "Shifts and masks explanation" for details */
	/* Additionally we determine if we must allocate extents.
	 * Basically,
	 * if n1 == 0 && n2 == 0 && n3 == 0, we must allocate root extent,
	 * if n2 == 0 && n3 == 0, we must allocate second level extent,
	 * if n3 == 0, we must allocate third level extent.
	 * Optimization:
	 * (n1 == 0 && n2 == 0 && n3 == 0) is identical to (id == 0)
	 * (n2 == 0 && n3 == 0) is identical to (id & mask1 == 0)
	 */
	matras_id_t extent1_available = id;
	matras_id_t n1 = id >> m->shift1;
	id &= m->mask1;
	matras_id_t extent2_available = id;
	matras_id_t n2 = id >> m->shift2;
	id &= m->mask2;
	matras_id_t extent3_available = id;
	matras_id_t n3 = id;

	void **extent1, **extent2;
	char *extent3;

	if (extent1_available) {
		extent1 = (void **)m->head.root;
	} else {
		extent1 = (void **)matras_alloc_extent(m);
		if (!extent1)
			return 0;
		m->head.root = (void *)extent1;
	}

	if (extent2_available) {
		extent2 = (void **)extent1[n1];
	} else {
		extent2 = (void **)matras_alloc_extent(m);
		if (!extent2) {
			if (!extent1_available) /* was created */
				matras_free_extent(m, extent1);
			return 0;
		}
		extent1[n1] = (void *)extent2;
	}

	if (extent3_available) {
		extent3 = (char *)extent2[n2];
	} else {
		extent3 = (char *)matras_alloc_extent(m);
		if (!extent3) {
			if (!extent1_available) /* was created */
				matras_free_extent(m, extent1);
			if (!extent2_available) /* was created */
				matras_free_extent(m, extent2);
			return 0;
		}
		extent2[n2] = (void *)extent3;
	}

	return (void *)(extent3 + n3 * m->block_size);
}